

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmq.c
# Opt level: O0

void nmq_start(NMQ *q)

{
  NMQ *q_local;
  
  if (q->inited == '\0') {
    q->inited = '\x01';
    init_steady_state(q);
    allocate_mem(q);
  }
  return;
}

Assistant:

void nmq_start(NMQ *q) {
    if (!q->inited) {
        q->inited = 1;
        init_steady_state(q);
        allocate_mem(q);
    }
}